

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::map_slot_policy<std::shared_ptr<vmips::VirtReg>,unsigned_long>::
     transfer<std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
               (allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  
  (new_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar3 = *(undefined4 *)old_slot;
  uVar4 = *(undefined4 *)
           ((long)&(old_slot->value).first.
                   super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
  uVar5 = *(undefined4 *)
           &(old_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  uVar6 = *(undefined4 *)
           ((long)&(old_slot->value).first.
                   super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           + 4);
  (old_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)new_slot = uVar3;
  *(undefined4 *)
   ((long)&(new_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = uVar4;
  *(undefined4 *)
   &(new_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar5;
  *(undefined4 *)
   ((long)&(new_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar6;
  (old_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (new_slot->value).second = (old_slot->value).second;
  p_Var2 = (old_slot->value).first.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1 = &p_Var2->_M_use_count;
    iVar7 = *p_Var1;
    *p_Var1 = *p_Var1 + -1;
    UNLOCK();
  }
  else {
    iVar7 = p_Var2->_M_use_count;
    p_Var2->_M_use_count = iVar7 + -1;
  }
  if (iVar7 == 1) {
    (*p_Var2->_vptr__Sp_counted_base[2])(p_Var2);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])(p_Var2);
      return;
    }
  }
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }